

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

symbol * Symbol_new(char *x)

{
  char *pcVar1;
  ushort *puVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  symbol *psVar6;
  symbol *psVar7;
  char *pcVar8;
  ushort **ppuVar9;
  FILE *__stream;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  rule *prVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  void *pvVar18;
  symbol *extraout_RAX;
  symbol *extraout_RAX_00;
  symbol *extraout_RAX_01;
  byte bVar19;
  char cVar20;
  ulong uVar21;
  undefined8 *puVar22;
  char cVar23;
  byte bVar24;
  char *pcVar25;
  int iVar26;
  uint uVar27;
  char *pcVar28;
  char *pcVar29;
  char *pcVar30;
  byte bVar31;
  long lVar32;
  size_t sVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  int iStack_3fd4;
  char *apcStack_3f90 [8];
  char *pcStack_3f50;
  uint uStack_3f48;
  uint uStack_3f44;
  char *pcStack_3f40;
  long lStack_3f38;
  undefined4 uStack_3f30;
  symbol *psStack_3f28;
  symbol *psStack_3f20;
  char *pcStack_3f18;
  uint uStack_3f10;
  undefined8 auStack_3f08 [999];
  undefined8 auStack_1fd0 [1001];
  rule *prStack_88;
  char *pcStack_80;
  char **ppcStack_78;
  int iStack_70;
  int *piStack_68;
  e_assoc eStack_60;
  int iStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  symbol *psStack_48;
  
  psVar6 = Symbol_find(x);
  psVar7 = psVar6;
  if (psVar6 == (symbol *)0x0) {
    lVar32 = 1;
    psVar7 = (symbol *)calloc(1,0x60);
    if (psVar7 == (symbol *)0x0) {
      Symbol_new_cold_1();
      psStack_48 = psVar6;
      memset(&pcStack_3f50,0,0x3f08);
      pcStack_3f50 = *(char **)(lVar32 + 0xb0);
      uStack_3f44 = 0;
      uStack_3f30 = 0;
      lStack_3f38 = lVar32;
      __stream = fopen(pcStack_3f50,"rb");
      if (__stream == (FILE *)0x0) {
        Parse_cold_9();
        return extraout_RAX;
      }
      fseek(__stream,0,2);
      uVar10 = ftell(__stream);
      rewind(__stream);
      uVar27 = (int)uVar10 + 1;
      pcVar8 = (char *)malloc((long)(int)uVar27);
      if (pcVar8 == (char *)0x0) {
        ErrorMsg(pcStack_3f50,0,"Can\'t allocate %d of memory to hold this file.",(ulong)uVar27);
        psVar7 = extraout_RAX_00;
      }
      else {
        sVar33 = (size_t)(int)uVar10;
        sVar11 = fread(pcVar8,1,sVar33,__stream);
        if (sVar11 == sVar33) {
          fclose(__stream);
          pcVar8[sVar33] = '\0';
          ppcVar3 = azDefine;
          iVar5 = nDefine;
          lVar12 = (long)nDefine;
          uVar10 = (ulong)(uint)nDefine;
          pcVar29 = pcVar8 + 6;
          uVar27 = 0;
          iStack_3fd4 = 0;
          uVar36 = 6;
          pcVar30 = pcVar8;
          for (lVar37 = 0; (cVar23 = pcVar8[lVar37], cVar23 == '\n' || (cVar23 != '\0'));
              lVar37 = lVar37 + 1) {
            if ((cVar23 == '%') &&
               ((pcVar14 = pcVar8 + lVar37, lVar37 == 0 || (pcVar14[-1] == '\n')))) {
              iVar4 = strncmp(pcVar14,"%endif",6);
              if ((iVar4 == 0) &&
                 (ppuVar9 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar9 + (long)pcVar14[6] * 2 + 1) & 0x20) != 0)) {
                pcVar14 = pcVar30;
                if (uVar27 == 0) {
LAB_00106361:
                  uVar27 = 0;
                }
                else {
                  uVar27 = uVar27 - 1;
                  if (uVar27 == 0) {
                    lVar13 = (long)iStack_3fd4;
                    if (lVar13 < lVar37) {
                      do {
                        if (pcVar8[lVar13] != '\n') {
                          pcVar8[lVar13] = ' ';
                        }
                        lVar13 = lVar13 + 1;
                      } while (lVar37 != lVar13);
                    }
                    goto LAB_00106361;
                  }
                }
                for (; (*pcVar14 != '\0' && (*pcVar14 != '\n')); pcVar14 = pcVar14 + 1) {
                  *pcVar14 = ' ';
                }
              }
              else {
                iVar4 = strncmp(pcVar14,"%ifdef",6);
                if (((iVar4 == 0) &&
                    (ppuVar9 = __ctype_b_loc(),
                    (*(byte *)((long)*ppuVar9 + (long)pcVar14[6] * 2 + 1) & 0x20) != 0)) ||
                   ((iVar4 = strncmp(pcVar14,"%ifndef",7), iVar4 == 0 &&
                    (ppuVar9 = __ctype_b_loc(),
                    (*(byte *)((long)*ppuVar9 + (long)pcVar14[7] * 2 + 1) & 0x20) != 0)))) {
                  pcVar25 = pcVar30;
                  if (uVar27 == 0) {
                    ppuVar9 = __ctype_b_loc();
                    uVar21 = uVar36;
                    pcVar28 = pcVar29;
                    do {
                      pcVar1 = pcVar28 + 1;
                      pcVar28 = pcVar28 + 1;
                      uVar21 = uVar21 + 1;
                    } while ((*(byte *)((long)*ppuVar9 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
                    cVar23 = pcVar8[uVar21 & 0xffffffff];
                    if (cVar23 == '\0') {
                      uVar38 = 0;
                    }
                    else {
                      uVar38 = 0;
                      do {
                        if ((*(byte *)((long)*ppuVar9 + (long)cVar23 * 2 + 1) & 0x20) != 0) break;
                        cVar23 = pcVar8[uVar38 + (uVar21 & 0xffffffff) + 1];
                        uVar38 = uVar38 + 1;
                      } while (cVar23 != '\0');
                    }
                    bVar39 = true;
                    bVar40 = 0 < lVar12;
                    if (0 < iVar5) {
                      bVar40 = true;
                      uVar21 = 1;
                      do {
                        pcVar1 = ppcVar3[uVar21 - 1];
                        iVar4 = strncmp(pcVar1,pcVar28,uVar38 & 0xffffffff);
                        if ((iVar4 == 0) && (sVar11 = strlen(pcVar1), (int)uVar38 == (int)sVar11)) {
                          bVar39 = false;
                          goto LAB_00106463;
                        }
                        bVar40 = (long)uVar21 < lVar12;
                        bVar39 = uVar21 != uVar10;
                        uVar21 = uVar21 + 1;
                      } while (bVar39);
                      bVar39 = true;
                    }
LAB_00106463:
                    if (pcVar14[3] != 'n') {
                      bVar40 = bVar39;
                    }
                    if (bVar40) {
                      iStack_3fd4 = (int)lVar37;
                    }
                    uVar27 = (uint)bVar40;
                  }
                  else {
                    uVar27 = uVar27 + 1;
                  }
                  for (; (*pcVar25 != '\0' && (*pcVar25 != '\n')); pcVar25 = pcVar25 + 1) {
                    *pcVar25 = ' ';
                  }
                }
              }
            }
            pcVar30 = pcVar30 + 1;
            pcVar29 = pcVar29 + 1;
            uVar36 = uVar36 + 1;
          }
          if (uVar27 != 0) {
            Parse_cold_1();
            if (x2a == (s_x2 *)0x0) {
              return (symbol *)0x0;
            }
            return (symbol *)(ulong)(uint)x2a->count;
          }
          uVar27 = 1;
          pcVar29 = pcVar8;
LAB_001064db:
          while( true ) {
            while( true ) {
              cVar23 = *pcVar29;
              lVar12 = (long)cVar23;
              if (lVar12 == 10) {
                uVar27 = uVar27 + 1;
              }
              else if (cVar23 == '\0') {
                free(pcVar8);
                *(ulong *)(lVar32 + 8) = CONCAT44(uStack_54,uStack_58);
                *(uint *)(lVar32 + 0x28) = uStack_3f44;
                return (symbol *)(ulong)uStack_3f44;
              }
              ppuVar9 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar9 + lVar12 * 2 + 1) & 0x20) == 0) break;
              pcVar29 = pcVar29 + 1;
            }
            if (cVar23 != '/') break;
            if (pcVar29[1] == '*') {
              cVar23 = pcVar29[2];
              bVar40 = cVar23 != '\0';
              if (cVar23 == '\0') {
                pcVar29 = pcVar29 + 2;
              }
              else {
                pcVar29 = pcVar29 + 3;
                do {
                  if (cVar23 == '\n') {
                    uVar27 = uVar27 + 1;
                  }
                  else if ((cVar23 == '/') && (pcVar29[-2] == '*')) break;
                  cVar23 = *pcVar29;
                  pcVar29 = pcVar29 + 1;
                  bVar40 = cVar23 != '\0';
                } while (bVar40);
                pcVar29 = pcVar29 + -1;
              }
              pcVar29 = pcVar29 + bVar40;
            }
            else {
              if (pcVar29[1] != '/') break;
              for (pcVar29 = pcVar29 + 2; (*pcVar29 != '\0' && (*pcVar29 != '\n'));
                  pcVar29 = pcVar29 + 1) {
              }
            }
          }
          uVar34 = uVar27;
          uStack_3f48 = uVar27;
          pcStack_3f40 = pcVar29;
          if (cVar23 == '{') {
            pcVar30 = pcVar29 + 1;
            bVar19 = pcVar29[1];
            if (bVar19 != 0) {
              iVar5 = 1;
              do {
                if ((iVar5 < 2) && (bVar19 == 0x7d)) {
                  pcVar29 = pcVar29 + 2;
                  goto LAB_001067a7;
                }
                if (bVar19 < 0x2f) {
                  if (bVar19 == 10) {
LAB_00106682:
                    uVar34 = uVar34 + 1;
                  }
                  else if ((bVar19 == 0x22) || (bVar19 == 0x27)) {
                    bVar24 = pcVar30[1];
                    pcVar30 = pcVar30 + 1;
                    if (bVar24 != 0) {
                      bVar31 = 0;
                      do {
                        if ((bVar31 != 0x5c) && (bVar24 == bVar19)) break;
                        uVar34 = uVar34 + (bVar24 == 10);
                        bVar40 = bVar31 == 0x5c;
                        bVar31 = bVar24;
                        if (bVar40) {
                          bVar31 = 0;
                        }
                        bVar24 = pcVar30[1];
                        pcVar30 = pcVar30 + 1;
                      } while (bVar24 != 0);
                    }
                  }
                }
                else if (bVar19 == 0x2f) {
                  if (pcVar29[2] == '/') {
                    for (pcVar30 = pcVar29 + 3; *pcVar30 != '\0'; pcVar30 = pcVar30 + 1) {
                      if (*pcVar30 == '\n') goto LAB_00106682;
                    }
                  }
                  else if (pcVar29[2] == '*') {
                    pcVar30 = pcVar29 + 3;
                    if (pcVar29[3] != '\0') {
                      cVar23 = '\0';
                      cVar20 = pcVar29[3];
                      do {
                        if (cVar23 == '*' && cVar20 == '/') break;
                        uVar34 = uVar34 + (cVar20 == '\n');
                        pcVar29 = pcVar30 + 1;
                        pcVar30 = pcVar30 + 1;
                        cVar23 = cVar20;
                        cVar20 = *pcVar29;
                      } while (*pcVar29 != '\0');
                    }
                  }
                }
                else if (bVar19 == 0x7b) {
                  iVar5 = iVar5 + 1;
                }
                else if (bVar19 == 0x7d) {
                  iVar5 = iVar5 + -1;
                }
                pcVar29 = pcVar30;
                pcVar30 = pcVar29 + 1;
                bVar19 = pcVar29[1];
              } while (bVar19 != 0);
            }
            ErrorMsg(pcStack_3f50,uVar27,
                     "C code starting on this line is not terminated before the end of the file.");
            uStack_3f44 = uStack_3f44 + 1;
            pcVar29 = pcVar30;
          }
          else {
            pcVar30 = pcVar29;
            if (cVar23 == '\"') {
              do {
                pcVar29 = pcVar30 + 1;
                while( true ) {
                  pcVar30 = pcVar29;
                  cVar23 = *pcVar30;
                  if (cVar23 == '\n') break;
                  pcVar29 = pcVar30 + 1;
                  if (cVar23 == '\"') goto LAB_001067a7;
                  if (cVar23 == '\0') {
                    Parse_cold_2();
                    pcVar29 = pcVar30;
                    goto LAB_001067a7;
                  }
                }
                uVar34 = uVar34 + 1;
              } while( true );
            }
            puVar2 = *ppuVar9;
            if ((puVar2[lVar12] & 8) == 0) {
              if ((cVar23 == '/') || (cVar23 == '|')) {
                if ((*(byte *)((long)puVar2 + (long)pcVar29[1] * 2 + 1) & 4) == 0)
                goto LAB_001067a1;
                cVar23 = pcVar29[2];
                pcVar30 = pcVar29 + 2;
                while ((pcVar29 = pcVar30, cVar23 != '\0' &&
                       ((cVar23 == '_' || ((puVar2[cVar23] & 8) != 0))))) {
                  cVar23 = pcVar30[1];
                  pcVar30 = pcVar30 + 1;
                }
              }
              else if (((cVar23 == ':') && (pcVar29[1] == ':')) && (pcVar29[2] == '=')) {
                pcVar30 = pcVar29 + 3;
                pcVar29 = pcVar30;
              }
              else {
LAB_001067a1:
                pcVar30 = pcVar29 + 1;
                pcVar29 = pcVar30;
              }
            }
            else {
              cVar23 = *pcVar29;
              while ((pcVar29 = pcVar30, cVar23 != '\0' &&
                     ((cVar23 == '_' || ((puVar2[cVar23] & 8) != 0))))) {
                cVar23 = pcVar30[1];
                pcVar30 = pcVar30 + 1;
              }
            }
          }
LAB_001067a7:
          uVar27 = uVar34;
          cVar23 = *pcVar30;
          *pcVar30 = '\0';
          pcVar14 = Strsafe(pcStack_3f40);
          uVar34 = uStack_3f10;
          psVar7 = psStack_3f28;
          switch(uStack_3f30) {
          case 0:
            prStack_88 = (rule *)0x0;
            uStack_4c = 0;
            iStack_5c = 0;
            uStack_58 = 0;
            uStack_54 = 0;
            uStack_50 = 0;
            *(undefined4 *)(lStack_3f38 + 0x14) = 0;
          case 1:
            cVar20 = *pcVar14;
            if ((long)cVar20 == 0x25) {
LAB_00106cd1:
              uStack_3f30 = 2;
            }
            else if ((*(byte *)((long)*ppuVar9 + (long)cVar20 * 2 + 1) & 2) == 0) {
              if (cVar20 == '[') {
                uStack_3f30 = 0xc;
              }
              else if (cVar20 == '{') {
                if (prStack_88 == (rule *)0x0) {
                  Parse_cold_8();
                  psVar7 = psStack_3f28;
                }
                else if (prStack_88->code == (char *)0x0) {
                  prStack_88->line = uStack_3f48;
                  prStack_88->code = pcVar14 + 1;
                }
                else {
                  Parse_cold_7();
                  psVar7 = psStack_3f28;
                }
              }
              else {
                pcVar25 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00107803:
                ErrorMsg(pcStack_3f50,uStack_3f48,pcVar25,pcVar14);
                uStack_3f44 = uStack_3f44 + 1;
                psVar7 = psStack_3f28;
              }
            }
            else {
              psStack_3f20 = Symbol_new(pcVar14);
              uStack_3f10 = 0;
              pcStack_3f18 = (char *)0x0;
              uStack_3f30 = 5;
              psVar7 = psStack_3f28;
            }
            break;
          case 2:
            if ((*(byte *)((long)*ppuVar9 + (long)*pcVar14 * 2 + 1) & 4) == 0) {
              pcVar25 = "Illegal declaration keyword: \"%s\".";
LAB_0010755f:
              ErrorMsg(pcStack_3f50,uStack_3f48,pcVar25,pcVar14);
LAB_001075a8:
              uStack_3f44 = uStack_3f44 + 1;
              uStack_3f30 = 0xf;
              psVar7 = psStack_3f28;
            }
            else {
              ppcStack_78 = (char **)0x0;
              piStack_68 = (int *)0x0;
              iStack_70 = 1;
              uStack_3f30 = 3;
              pcStack_80 = pcVar14;
              iVar5 = strcmp(pcVar14,"name");
              if (iVar5 == 0) {
                ppcStack_78 = (char **)(lStack_3f38 + 0x40);
                goto LAB_00107239;
              }
              iVar5 = strcmp(pcVar14,"include");
              if (iVar5 == 0) {
                ppcStack_78 = (char **)(lStack_3f38 + 0x70);
                psVar7 = psStack_3f28;
                break;
              }
              iVar5 = strcmp(pcVar14,"code");
              if (iVar5 == 0) {
                lVar12 = 0x98;
              }
              else {
                iVar5 = strcmp(pcVar14,"token_destructor");
                if (iVar5 == 0) {
                  lVar12 = 0xa0;
                }
                else {
                  iVar5 = strcmp(pcVar14,"default_destructor");
                  if (iVar5 != 0) {
                    iVar5 = strcmp(pcVar14,"token_prefix");
                    if (iVar5 == 0) {
                      ppcStack_78 = (char **)(lStack_3f38 + 0xc0);
LAB_00107239:
                      iStack_70 = 0;
                      psVar7 = psStack_3f28;
                    }
                    else {
                      iVar5 = strcmp(pcVar14,"syntax_error");
                      if (iVar5 != 0) {
                        iVar5 = strcmp(pcVar14,"parse_accept");
                        if (iVar5 == 0) {
                          lVar12 = 0x90;
                        }
                        else {
                          iVar5 = strcmp(pcVar14,"parse_failure");
                          if (iVar5 != 0) {
                            iVar5 = strcmp(pcVar14,"stack_overflow");
                            if (iVar5 != 0) {
                              iVar5 = strcmp(pcVar14,"extra_argument");
                              if (iVar5 == 0) {
                                ppcStack_78 = (char **)(lStack_3f38 + 0x48);
                              }
                              else {
                                iVar5 = strcmp(pcVar14,"token_type");
                                if (iVar5 == 0) {
                                  ppcStack_78 = (char **)(lStack_3f38 + 0x50);
                                }
                                else {
                                  iVar5 = strcmp(pcVar14,"default_type");
                                  if (iVar5 == 0) {
                                    ppcStack_78 = (char **)(lStack_3f38 + 0x58);
                                  }
                                  else {
                                    iVar5 = strcmp(pcVar14,"stack_size");
                                    if (iVar5 == 0) {
                                      ppcStack_78 = (char **)(lStack_3f38 + 0x68);
                                    }
                                    else {
                                      iVar5 = strcmp(pcVar14,"start_symbol");
                                      if (iVar5 != 0) {
                                        iVar5 = strcmp(pcVar14,"left");
                                        if (iVar5 == 0) {
                                          iStack_5c = iStack_5c + 1;
                                          eStack_60 = LEFT;
                                        }
                                        else {
                                          iVar5 = strcmp(pcVar14,"right");
                                          if (iVar5 == 0) {
                                            iStack_5c = iStack_5c + 1;
                                            eStack_60 = RIGHT;
                                          }
                                          else {
                                            iVar5 = strcmp(pcVar14,"nonassoc");
                                            if (iVar5 != 0) {
                                              iVar5 = strcmp(pcVar14,"destructor");
                                              if (iVar5 == 0) {
                                                uStack_3f30 = 0x10;
                                                psVar7 = psStack_3f28;
                                              }
                                              else {
                                                iVar5 = strcmp(pcVar14,"type");
                                                if (iVar5 == 0) {
                                                  uStack_3f30 = 0x11;
                                                  psVar7 = psStack_3f28;
                                                }
                                                else {
                                                  iVar5 = strcmp(pcVar14,"fallback");
                                                  if (iVar5 == 0) {
                                                    psStack_3f28 = (symbol *)0x0;
                                                    uStack_3f30 = 0x12;
                                                    psVar7 = psStack_3f28;
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar14,"wildcard");
                                                    if (iVar5 == 0) {
                                                      uStack_3f30 = 0x14;
                                                      psVar7 = psStack_3f28;
                                                    }
                                                    else {
                                                      iVar5 = strcmp(pcVar14,"expect");
                                                      if (iVar5 != 0) {
                                                        pcVar25 = 
                                                  "Unknown declaration keyword: \"%%%s\".";
                                                  goto LAB_0010755f;
                                                  }
                                                  if (-1 < *(int *)(lStack_3f38 + 0xcc)) {
                                                    pcVar14 = "Multiple %expect declarations.";
                                                    goto LAB_001075a1;
                                                  }
                                                  uStack_3f30 = 0x13;
                                                  psVar7 = psStack_3f28;
                                                  }
                                                  }
                                                }
                                              }
                                              break;
                                            }
                                            iStack_5c = iStack_5c + 1;
                                            eStack_60 = NONE;
                                          }
                                        }
                                        uStack_3f30 = 4;
                                        psVar7 = psStack_3f28;
                                        break;
                                      }
                                      ppcStack_78 = (char **)(lStack_3f38 + 0x60);
                                    }
                                  }
                                }
                              }
                              goto LAB_00107239;
                            }
                            ppcStack_78 = (char **)(lStack_3f38 + 0x80);
                            psVar7 = psStack_3f28;
                            break;
                          }
                          lVar12 = 0x88;
                        }
                        goto LAB_00107671;
                      }
                      ppcStack_78 = (char **)(lStack_3f38 + 0x78);
                      psVar7 = psStack_3f28;
                    }
                    break;
                  }
                  lVar12 = 0xa8;
                }
              }
LAB_00107671:
              ppcStack_78 = (char **)(lStack_3f38 + lVar12);
              psVar7 = psStack_3f28;
            }
            break;
          case 3:
            cVar20 = *pcVar14;
            if (((cVar20 != '\"') && (cVar20 != '{')) && (((*ppuVar9)[cVar20] & 8) == 0)) {
              ErrorMsg(pcStack_3f50,uStack_3f48,"Illegal argument to %%%s: %s",pcStack_80,pcVar14);
              goto LAB_001075a8;
            }
            if ((cVar20 == '{') || (cVar20 == '\"')) {
              pcVar14 = pcVar14 + 1;
            }
            sVar11 = strlen(pcVar14);
            pcVar25 = *ppcStack_78;
            if (pcVar25 == (char *)0x0) {
              pcVar25 = "";
            }
            sVar33 = strlen(pcVar25);
            bVar40 = false;
            if ((*(int *)(lStack_3f38 + 0xdc) == 0) && (iStack_70 != 0)) {
              if (piStack_68 == (int *)0x0) {
                bVar40 = true;
              }
              else {
                bVar40 = *piStack_68 != 0;
              }
            }
            iVar5 = (int)sVar11;
            iVar4 = (int)sVar33;
            iVar26 = iVar5 + iVar4 + 0x14;
            if (bVar40) {
              iVar35 = 0;
              pcVar25 = pcStack_3f50;
              do {
                if (*pcVar25 == '\\') {
                  iVar35 = iVar35 + 1;
                }
                else if (*pcVar25 == '\0') goto LAB_00107330;
                pcVar25 = pcVar25 + 1;
              } while( true );
            }
            sVar11 = 0;
            goto LAB_00107374;
          case 4:
            if ((long)*pcVar14 == 0x2e) goto LAB_0010704a;
            if ((*(byte *)((long)*ppuVar9 + (long)*pcVar14 * 2 + 1) & 1) == 0) {
              pcVar25 = "Can\'t assign a precedence to \"%s\".";
            }
            else {
              psVar7 = Symbol_new(pcVar14);
              if (psVar7->prec < 0) {
                psVar7->prec = iStack_5c;
                psVar7->assoc = eStack_60;
                psVar7 = psStack_3f28;
                break;
              }
              pcVar25 = "Symbol \"%s\" has already be given a precedence.";
            }
            goto LAB_00107803;
          case 5:
            if (*pcVar14 == '(') {
              uStack_3f30 = 7;
            }
            else {
              if (((*pcVar14 == ':') && (pcVar14[1] == ':')) && (pcVar14[2] == '='))
              goto LAB_00106943;
              pcVar14 = psStack_3f20->name;
              pcVar25 = "Expected to see a \":\" following the LHS symbol \"%s\".";
LAB_00107866:
              ErrorMsg(pcStack_3f50,uStack_3f48,pcVar25,pcVar14);
LAB_0010786d:
              uStack_3f44 = uStack_3f44 + 1;
              uStack_3f30 = 0xe;
              psVar7 = psStack_3f28;
            }
            break;
          case 6:
            cVar20 = *pcVar14;
            if ((long)cVar20 == 0x2e) {
              uVar10 = (ulong)uStack_3f10;
              lVar12 = (long)(int)uStack_3f10;
              prVar15 = (rule *)calloc(lVar12 * 0x10 + 0x60,1);
              if (prVar15 == (rule *)0x0) {
                ErrorMsg(pcStack_3f50,uStack_3f48,"Can\'t allocate enough memory for this rule.");
                uStack_3f44 = uStack_3f44 + 1;
                prStack_88 = (rule *)0x0;
              }
              else {
                prVar15->ruleline = uStack_3f48;
                prVar15->rhs = &prVar15[1].lhs;
                prVar15->rhsalias = (char **)(&prVar15[1].lhs + lVar12);
                if (0 < (int)uVar34) {
                  uVar36 = 0;
                  do {
                    prVar15->rhs[uVar36] = (symbol *)auStack_3f08[uVar36];
                    prVar15->rhsalias[uVar36] = (char *)auStack_1fd0[uVar36 + 1];
                    uVar36 = uVar36 + 1;
                  } while (uVar10 != uVar36);
                }
                prVar15->lhs = psStack_3f20;
                prVar15->lhsalias = pcStack_3f18;
                prVar15->nrhs = uVar34;
                prVar15->code = (char *)0x0;
                prVar15->precsym = (symbol *)0x0;
                iVar5 = *(int *)(lStack_3f38 + 0x14);
                *(int *)(lStack_3f38 + 0x14) = iVar5 + 1;
                prVar15->index = iVar5;
                prVar15->nextlhs = psStack_3f20->rule;
                psStack_3f20->rule = prVar15;
                prVar15->next = (rule *)0x0;
                bVar40 = CONCAT44(uStack_54,uStack_58) != 0;
                puVar22 = (undefined8 *)(CONCAT44(uStack_4c,uStack_50) + 0x58);
                if (!bVar40) {
                  puVar22 = (undefined8 *)&uStack_50;
                }
                *puVar22 = prVar15;
                *(rule **)(&uStack_58 + (ulong)bVar40 * 2) = prVar15;
                prStack_88 = prVar15;
              }
              uStack_3f30 = 1;
              psVar7 = psStack_3f28;
            }
            else {
              if ((*(byte *)((long)*ppuVar9 + (long)cVar20 * 2 + 1) & 4) == 0) {
                if (cVar20 == '(') {
LAB_001074ee:
                  if (0 < (int)uStack_3f10) {
                    uStack_3f30 = 10;
                    break;
                  }
                }
                else if ((cVar20 == '|') || (cVar20 == '/')) {
                  lVar12 = (long)(int)uStack_3f10;
                  if (0 < lVar12) {
                    puVar22 = (undefined8 *)auStack_3f08[uStack_3f10 - 1];
                    puVar16 = puVar22;
                    if (*(int *)((long)puVar22 + 0xc) != 2) {
                      puVar16 = (undefined8 *)calloc(1,0x60);
                      *puVar16 = 0;
                      puVar16[1] = 0;
                      puVar16[10] = 0;
                      puVar16[0xb] = 0;
                      puVar16[2] = 0;
                      puVar16[3] = 0;
                      puVar16[4] = 0;
                      puVar16[5] = 0;
                      puVar16[6] = 0;
                      puVar16[7] = 0;
                      puVar16[8] = 0;
                      puVar16[9] = 0;
                      *(undefined4 *)((long)puVar16 + 0xc) = 2;
                      *(undefined4 *)((long)puVar16 + 0x54) = 1;
                      puVar17 = (undefined8 *)calloc(1,8);
                      puVar16[0xb] = puVar17;
                      *puVar17 = puVar22;
                      *puVar16 = *puVar22;
                      auStack_3f08[lVar12 + -1] = puVar16;
                    }
                    iVar5 = *(int *)((long)puVar16 + 0x54);
                    *(int *)((long)puVar16 + 0x54) = iVar5 + 1;
                    pvVar18 = realloc((void *)puVar16[0xb],(long)iVar5 * 8 + 8);
                    puVar16[0xb] = pvVar18;
                    psVar7 = Symbol_new(pcVar14 + 1);
                    *(symbol **)(puVar16[0xb] + -8 + (long)*(int *)((long)puVar16 + 0x54) * 8) =
                         psVar7;
                    if (((*(byte *)((long)*ppuVar9 + (long)pcVar14[1] * 2 + 1) & 2) != 0) ||
                       (psVar7 = psStack_3f28,
                       (*(byte *)((long)*ppuVar9 +
                                 (long)*(char *)**(undefined8 **)puVar16[0xb] * 2 + 1) & 2) != 0)) {
                      Parse_cold_3();
                      psVar7 = psStack_3f28;
                    }
                    break;
                  }
                  if (cVar20 == '(') goto LAB_001074ee;
                }
                pcVar25 = "Illegal character on RHS of rule: \"%s\".";
                goto LAB_00107866;
              }
              if (999 < (int)uStack_3f10) {
                pcVar25 = "Too many symbols on RHS of rule beginning at \"%s\".";
                goto LAB_00107866;
              }
              psVar7 = Symbol_new(pcVar14);
              auStack_3f08[(int)uStack_3f10] = psVar7;
              auStack_1fd0[(long)(int)uStack_3f10 + 1] = 0;
              uStack_3f10 = uStack_3f10 + 1;
              psVar7 = psStack_3f28;
            }
            break;
          case 7:
            if ((*(byte *)((long)*ppuVar9 + (long)*pcVar14 * 2 + 1) & 4) == 0) {
              pcVar25 = psStack_3f20->name;
              pcVar28 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
LAB_001075eb:
              ErrorMsg(pcStack_3f50,uStack_3f48,pcVar28,pcVar14,pcVar25);
              goto LAB_0010786d;
            }
            uStack_3f30 = 8;
            pcStack_3f18 = pcVar14;
            break;
          case 8:
            if (*pcVar14 != ')') {
LAB_001074b1:
              pcVar25 = "Missing \")\" following LHS alias name \"%s\".";
              pcVar14 = pcStack_3f18;
              goto LAB_00107866;
            }
            uStack_3f30 = 9;
            break;
          case 9:
            if (((*pcVar14 != ':') || (pcVar14[1] != ':')) || (pcVar14[2] != '=')) {
              pcVar14 = psStack_3f20->name;
              pcVar28 = "Missing \"->\" following: \"%s(%s)\".";
              pcVar25 = pcStack_3f18;
              goto LAB_001075eb;
            }
            goto LAB_00106943;
          case 10:
            if ((*(byte *)((long)*ppuVar9 + (long)*pcVar14 * 2 + 1) & 4) == 0) {
              pcVar25 = *(char **)auStack_3f08[(long)(int)uStack_3f10 + -1];
              pcVar28 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
              goto LAB_001075eb;
            }
            auStack_1fd0[(int)uStack_3f10] = pcVar14;
            uStack_3f30 = 0xb;
            break;
          case 0xb:
            if (*pcVar14 != ')') goto LAB_001074b1;
LAB_00106943:
            uStack_3f30 = 6;
            break;
          case 0xc:
            if ((*(byte *)((long)*ppuVar9 + (long)*pcVar14 * 2 + 1) & 1) == 0) {
              Parse_cold_6();
            }
            else if (prStack_88 == (rule *)0x0) {
              ErrorMsg(pcStack_3f50,uStack_3f48,
                       "There is no prior rule to assign precedence \"[%s]\".",pcVar14);
              uStack_3f44 = uStack_3f44 + 1;
            }
            else if (prStack_88->precsym == (symbol *)0x0) {
              psVar7 = Symbol_new(pcVar14);
              prStack_88->precsym = psVar7;
            }
            else {
              Parse_cold_5();
            }
            uStack_3f30 = 0xd;
            psVar7 = psStack_3f28;
            break;
          case 0xd:
            if (*pcVar14 != ']') {
              Parse_cold_4();
            }
            goto LAB_0010704a;
          case 0xe:
          case 0xf:
            if (*pcVar14 == '.') {
              uStack_3f30 = 1;
            }
            if (*pcVar14 != '%') break;
            goto LAB_00106cd1;
          case 0x10:
            if ((*(byte *)((long)*ppuVar9 + (long)*pcVar14 * 2 + 1) & 4) == 0) {
              pcVar14 = "Symbol name missing after %%destructor keyword";
LAB_001075a1:
              ErrorMsg(pcStack_3f50,uStack_3f48,pcVar14);
              goto LAB_001075a8;
            }
            psVar7 = Symbol_new(pcVar14);
            ppcStack_78 = &psVar7->destructor;
            piStack_68 = &psVar7->destLineno;
            iStack_70 = 1;
            uStack_3f30 = 3;
            psVar7 = psStack_3f28;
            break;
          case 0x11:
            if ((*(byte *)((long)*ppuVar9 + (long)*pcVar14 * 2 + 1) & 4) == 0) {
              pcVar14 = "Symbol name missing after %%type keyword";
              goto LAB_001075a1;
            }
            psVar7 = Symbol_find(pcVar14);
            if (psVar7 == (symbol *)0x0) {
              psVar7 = Symbol_new(pcVar14);
            }
            else if (psVar7->datatype != (char *)0x0) {
              ErrorMsg(pcStack_3f50,uStack_3f48,"Symbol %%type \"%s\" already defined",pcVar14);
              uStack_3f44 = uStack_3f44 + 1;
              uStack_3f30 = 0xf;
              psVar7 = psStack_3f28;
              break;
            }
            ppcStack_78 = &psVar7->datatype;
            iStack_70 = 0;
            uStack_3f30 = 3;
            psVar7 = psStack_3f28;
            break;
          case 0x12:
            if ((long)*pcVar14 == 0x2e) goto LAB_0010704a;
            if ((*(byte *)((long)*ppuVar9 + (long)*pcVar14 * 2 + 1) & 1) == 0) {
              pcVar25 = "%%fallback argument \"%s\" should be a token";
              goto LAB_00107803;
            }
            psVar7 = Symbol_new(pcVar14);
            if (psStack_3f28 != (symbol *)0x0) {
              if (psVar7->fallback != (symbol *)0x0) {
                pcVar25 = "More than one fallback assigned to token %s";
                goto LAB_00107803;
              }
              psVar7->fallback = psStack_3f28;
              *(undefined4 *)(lStack_3f38 + 0xd8) = 1;
              psVar7 = psStack_3f28;
            }
            break;
          case 0x13:
            lVar12 = strtol(pcVar14,apcStack_3f90,10);
            *(int *)(lStack_3f38 + 0xcc) = (int)lVar12;
            if ((apcStack_3f90[0] == pcVar14) || (*apcStack_3f90[0] != '\0')) {
              pcVar14 = "Integer expected after %%expect keyword";
            }
            else {
              if (-1 < (int)lVar12) goto LAB_0010704a;
              pcVar14 = "Integer can\'t be negative after %%expect keyword";
            }
            ErrorMsg(pcStack_3f50,uStack_3f48,pcVar14);
            uStack_3f44 = uStack_3f44 + 1;
            goto LAB_0010704a;
          case 0x14:
            if ((long)*pcVar14 != 0x2e) {
              if ((*(byte *)((long)*ppuVar9 + (long)*pcVar14 * 2 + 1) & 1) == 0) {
                pcVar25 = "%%wildcard argument \"%s\" should be a token";
              }
              else {
                psVar7 = Symbol_new(pcVar14);
                if (*(long *)(lStack_3f38 + 0x38) == 0) {
                  *(symbol **)(lStack_3f38 + 0x38) = psVar7;
                  psVar7 = psStack_3f28;
                  break;
                }
                pcVar25 = "Extra wildcard to token: %s";
              }
              goto LAB_00107803;
            }
LAB_0010704a:
            uStack_3f30 = 1;
            psVar7 = psStack_3f28;
          }
          goto switchD_001067dd_default;
        }
        ErrorMsg(pcStack_3f50,0,"Can\'t read in all %d bytes of this file.",uVar10 & 0xffffffff);
        free(pcVar8);
        psVar7 = extraout_RAX_01;
      }
      *(int *)(lVar32 + 0x28) = *(int *)(lVar32 + 0x28) + 1;
      return psVar7;
    }
    pcVar8 = Strsafe(x);
    psVar7->name = pcVar8;
    ppuVar9 = __ctype_b_loc();
    psVar7->type = (uint)(((*ppuVar9)[*x] >> 8 & 1) == 0);
    psVar7->rule = (rule *)0x0;
    psVar7->fallback = (symbol *)0x0;
    psVar7->prec = -1;
    psVar7->assoc = UNK;
    psVar7->datatype = (char *)0x0;
    *(undefined8 *)&psVar7->useCnt = 0;
    *(undefined8 *)((long)&psVar7->destructor + 4) = 0;
    psVar7->firstset = (char *)0x0;
    psVar7->lambda = LEMON_FALSE;
    psVar7->useCnt = 0;
    Symbol_insert(psVar7,pcVar8);
  }
  psVar7->useCnt = psVar7->useCnt + 1;
  return psVar7;
LAB_00107330:
  sprintf((char *)apcStack_3f90,"#line %d ",(ulong)uStack_3f48);
  sVar11 = strlen((char *)apcStack_3f90);
  sVar33 = strlen(pcStack_3f50);
  iVar26 = iVar35 + iVar26 + (int)sVar11 + (int)sVar33;
  sVar11 = (size_t)(int)sVar11;
LAB_00107374:
  pcVar25 = (char *)realloc(*ppcStack_78,(long)iVar26);
  *ppcStack_78 = pcVar25;
  pcVar25 = *ppcStack_78 + iVar4;
  if (bVar40) {
    if ((iVar4 != 0) && (pcVar25[-1] != '\n')) {
      *pcVar25 = '\n';
      pcVar25 = pcVar25 + 1;
    }
    memcpy(pcVar25,apcStack_3f90,sVar11);
    pcVar28 = pcVar25 + sVar11;
    pcVar25[sVar11] = '\"';
    pcVar25 = pcStack_3f50;
    do {
      if (*pcVar25 == '\\') {
        pcVar28[1] = '\\';
        pcVar28 = pcVar28 + 2;
      }
      else {
        if (*pcVar25 == '\0') goto LAB_0010740f;
        pcVar28 = pcVar28 + 1;
      }
      *pcVar28 = *pcVar25;
      pcVar25 = pcVar25 + 1;
    } while( true );
  }
LAB_0010741c:
  if ((piStack_68 != (int *)0x0) && (*piStack_68 == 0)) {
    *piStack_68 = uStack_3f48;
  }
  memcpy(pcVar25,pcVar14,(long)iVar5);
  pcVar25[iVar5] = '\0';
  uStack_3f30 = 1;
  psVar7 = psStack_3f28;
switchD_001067dd_default:
  psStack_3f28 = psVar7;
  *pcVar30 = cVar23;
  goto LAB_001064db;
LAB_0010740f:
  pcVar28[1] = '\"';
  pcVar28[2] = '\n';
  pcVar25 = pcVar28 + 3;
  goto LAB_0010741c;
}

Assistant:

struct symbol *Symbol_new(const char *x)
{
  struct symbol *sp;

  sp = Symbol_find(x);
  if( sp==0 ){
    sp = (struct symbol *)calloc(1, sizeof(struct symbol) );
    MemoryCheck(sp);
    sp->name = Strsafe(x);
    sp->type = isupper(*x) ? TERMINAL : NONTERMINAL;
    sp->rule = 0;
    sp->fallback = 0;
    sp->prec = -1;
    sp->assoc = UNK;
    sp->firstset = 0;
    sp->lambda = LEMON_FALSE;
    sp->destructor = 0;
    sp->destLineno = 0;
    sp->datatype = 0;
    sp->useCnt = 0;
    Symbol_insert(sp,sp->name);
  }
  sp->useCnt++;
  return sp;
}